

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterized.cpp
# Opt level: O2

void __thiscall
iu_TestP_x_iutest_x_TestB_Test::iu_TestP_x_iutest_x_TestB_Test(iu_TestP_x_iutest_x_TestB_Test *this)

{
  TestP::TestP(&this->super_type);
  (this->super_type).super_TestWithParam<int>.super_Test._vptr_Test =
       (_func_int **)&PTR__TestWithParam_0023e2b0;
  (this->super_type).super_TestWithParam<int>.super_WithParamInterface<int>._vptr_WithParamInterface
       = (_func_int **)&PTR__iu_TestP_x_iutest_x_TestB_Test_0023e2f0;
  return;
}

Assistant:

IUTEST_P(TestP, TestB)
{
    IUTEST_ASSERT_EQ(b, GetParam());
    ++b;
}